

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O3

void __thiscall Chip8::LoadROM(Chip8 *this,string *filename)

{
  ulong uVar1;
  uint8_t *puVar2;
  ifstream file;
  char acStack_218 [520];
  
  std::ifstream::ifstream(acStack_218,(string *)filename,_S_bin|_S_ate);
  uVar1 = std::istream::tellg();
  this->size = uVar1;
  puVar2 = (uint8_t *)operator_new__(uVar1);
  this->memory = puVar2;
  std::istream::seekg((long)acStack_218,_S_beg);
  std::istream::read(acStack_218,(long)this->memory);
  std::ifstream::close();
  std::ifstream::~ifstream(acStack_218);
  return;
}

Assistant:

void Chip8::LoadROM(std::string filename) {
    std::ifstream file(filename, std::ios::ate | std::ios::binary);
    size = file.tellg();
    memory = new uint8_t [size];
    file.seekg(0, std::ios::beg);
    file.read(reinterpret_cast<char *>(memory), size);



    file.close();
}